

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_highbd_comp_avg_pred_c
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               )

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (0 < height) {
    lVar3 = (long)comp_pred8 * 2;
    lVar4 = (long)ref8 * 2;
    lVar2 = (long)pred8 * 2;
    iVar5 = 0;
    do {
      if (0 < width) {
        uVar1 = 0;
        do {
          *(short *)(lVar3 + uVar1 * 2) =
               (short)((uint)*(ushort *)(lVar2 + uVar1 * 2) + (uint)*(ushort *)(lVar4 + uVar1 * 2) +
                       1 >> 1);
          uVar1 = uVar1 + 1;
        } while ((uint)width != uVar1);
      }
      iVar5 = iVar5 + 1;
      lVar3 = lVar3 + (long)width * 2;
      lVar4 = lVar4 + (long)ref_stride * 2;
      lVar2 = lVar2 + (long)width * 2;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_pred_c(uint8_t *comp_pred8, const uint8_t *pred8,
                                int width, int height, const uint8_t *ref8,
                                int ref_stride) {
  int i, j;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}